

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ThreadSafeArena::~ThreadSafeArena(ThreadSafeArena *this)

{
  bool bVar1;
  AllocationPolicy *policy;
  Memory MVar2;
  ArenaMetricsCollector *local_80;
  GetDeallocator local_48;
  ArenaMetricsCollector *local_38;
  ArenaMetricsCollector *collector;
  AllocationPolicy *p;
  Memory mem;
  size_t space_allocated;
  ThreadSafeArena *this_local;
  
  CleanupList(this);
  mem.size = 0;
  MVar2 = Free(this,&mem.size);
  mem.ptr = (void *)MVar2.size;
  p = (AllocationPolicy *)MVar2.ptr;
  collector = (ArenaMetricsCollector *)
              TaggedAllocationPolicyPtr::get((TaggedAllocationPolicyPtr *)(this + 8));
  if ((AllocationPolicy *)collector == (AllocationPolicy *)0x0) {
    local_80 = (ArenaMetricsCollector *)0x0;
  }
  else {
    local_80 = ((AllocationPolicy *)collector)->metrics_collector;
  }
  local_38 = local_80;
  bVar1 = TaggedAllocationPolicyPtr::is_user_owned_initial_block
                    ((TaggedAllocationPolicyPtr *)(this + 8));
  if (bVar1) {
    mem.size = (long)mem.ptr + mem.size;
  }
  else {
    policy = TaggedAllocationPolicyPtr::get((TaggedAllocationPolicyPtr *)(this + 8));
    GetDeallocator::GetDeallocator(&local_48,policy,&mem.size);
    MVar2.size = (size_t)mem.ptr;
    MVar2.ptr = p;
    GetDeallocator::operator()(&local_48,MVar2);
  }
  if (local_38 != (ArenaMetricsCollector *)0x0) {
    (*(code *)**(undefined8 **)local_38)(local_38,mem.size);
  }
  return;
}

Assistant:

ThreadSafeArena::~ThreadSafeArena() {
  // Have to do this in a first pass, because some of the destructors might
  // refer to memory in other blocks.
  CleanupList();

  size_t space_allocated = 0;
  auto mem = Free(&space_allocated);

  // Policy is about to get deleted.
  auto* p = alloc_policy_.get();
  ArenaMetricsCollector* collector = p ? p->metrics_collector : nullptr;

  if (alloc_policy_.is_user_owned_initial_block()) {
    space_allocated += mem.size;
  } else {
    GetDeallocator(alloc_policy_.get(), &space_allocated)(mem);
  }

  if (collector) collector->OnDestroy(space_allocated);
}